

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void WindowSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiWindow **ppIVar1;
  ulong uVar2;
  ulong uVar3;
  ImGuiContext *g;
  
  uVar2 = (ulong)(uint)(ctx->Windows).Size;
  if (uVar2 != 0) {
    ppIVar1 = (ctx->Windows).Data;
    uVar3 = 0;
    do {
      ppIVar1[uVar3]->SettingsOffset = -1;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  ImChunkStream<ImGuiWindowSettings>::clear(&ctx->SettingsWindows);
  return;
}

Assistant:

static void WindowSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
        g.Windows[i]->SettingsOffset = -1;
    g.SettingsWindows.clear();
}